

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

BOOL __thiscall LASinterval::get_merged_cell(LASinterval *this)

{
  bool bVar1;
  LASinterval *this_local;
  
  bVar1 = this->merged_cells != (LASintervalStartCell *)0x0;
  if (bVar1) {
    this->full = this->merged_cells->full;
    this->total = this->merged_cells->total;
    this->current_cell = &this->merged_cells->super_LASintervalCell;
  }
  return bVar1;
}

Assistant:

BOOL LASinterval::get_merged_cell()
{
  if (merged_cells)
  {
    full = merged_cells->full;
    total = merged_cells->total;
    current_cell = merged_cells;
    return TRUE;
  }
  return FALSE;
}